

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O3

int stream_obq_move(nghttp2_stream *dest,nghttp2_stream *src,nghttp2_stream *stream)

{
  int iVar1;
  
  if (stream->queued != '\0') {
    nghttp2_pq_remove(&src->obq,&stream->pq_entry);
    stream->queued = '\0';
    iVar1 = stream_obq_push(dest,stream);
    return iVar1;
  }
  return 0;
}

Assistant:

static int stream_obq_move(nghttp2_stream *dest, nghttp2_stream *src,
                           nghttp2_stream *stream) {
  if (!stream->queued) {
    return 0;
  }

  DEBUGF("stream: remove stream %d from stream %d (move)\n", stream->stream_id,
         src->stream_id);

  nghttp2_pq_remove(&src->obq, &stream->pq_entry);
  stream->queued = 0;

  return stream_obq_push(dest, stream);
}